

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_dbs.cc
# Opt level: O0

void anon_unknown.dwarf_43804::Json2Type(Value *value,DrdsDescribeDrdsDBsDbType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  DrdsDescribeDrdsDBsDbType *local_18;
  DrdsDescribeDrdsDBsDbType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (DrdsDescribeDrdsDBsDbType *)value;
  bVar1 = Json::Value::isMember(value,"DbName");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DbName");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar3);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Status");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Status");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->status = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"CreateTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"CreateTime");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->create_time,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Msg");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Msg");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->msg,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Mode");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Mode");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->mode,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, DrdsDescribeDrdsDBsDbType* item) {
  if(value.isMember("DbName")) {
    item->db_name = value["DbName"].asString();
  }
  if(value.isMember("Status")) {
    item->status = value["Status"].asInt();
  }
  if(value.isMember("CreateTime")) {
    item->create_time = value["CreateTime"].asString();
  }
  if(value.isMember("Msg")) {
    item->msg = value["Msg"].asString();
  }
  if(value.isMember("Mode")) {
    item->mode = value["Mode"].asString();
  }
}